

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtzobj.cpp
# Opt level: O1

int __thiscall
CVmObjTimeZone::getp_getHistory(CVmObjTimeZone *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  vm_obj_id_t vVar2;
  char *pcVar3;
  uint uVar4;
  
  if (oargc == (uint *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = *oargc;
  }
  if (getp_getHistory(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_getHistory();
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getHistory::desc);
  if (iVar1 != 0) {
    return 1;
  }
  if ((uVar4 == 0) || (sp_[-1].typ == VM_NIL)) {
    vVar2 = CVmTimeZone::get_history_list(*(CVmTimeZone **)(this->super_CVmObject).ext_);
  }
  else {
    if ((sp_[-1].typ == VM_OBJ) &&
       (iVar1 = (**(code **)(*(long *)&G_obj_table_X.pages_[sp_[-1].val.obj >> 0xc]
                                       [sp_[-1].val.obj & 0xfff].ptr_ + 8))
                          (G_obj_table_X.pages_[sp_[-1].val.obj >> 0xc] + (sp_[-1].val.obj & 0xfff),
                           CVmObjDate::metaclass_reg_), iVar1 != 0)) {
      pcVar3 = (G_obj_table_X.pages_[sp_[-1].val.obj >> 0xc]->ptr_).obj_ +
               (sp_[-1].val.obj & 0xfff) * 0x18;
    }
    else {
      pcVar3 = (char *)0x0;
    }
    if (pcVar3 == (char *)0x0) {
      err_throw(0x900);
    }
    vVar2 = CVmTimeZone::get_history_item
                      (*(CVmTimeZone **)(this->super_CVmObject).ext_,**(int32_t **)(pcVar3 + 8),
                       (*(int32_t **)(pcVar3 + 8))[1]);
  }
  retval->typ = VM_OBJ;
  (retval->val).obj = vVar2;
  sp_ = sp_ + -(long)(int)uVar4;
  return 1;
}

Assistant:

int CVmObjTimeZone::getp_getHistory(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* check for a Date argument */
    if (argc >= 1 && G_stk->get(0)->typ != VM_NIL)
    {
        /* there's a date - retrieve it */
        CVmObjDate *date = vm_val_cast(CVmObjDate, G_stk->get(0));
        if (date == 0)
            err_throw(VMERR_BAD_TYPE_BIF);

        /* get the history for the given date only */
        retval->set_obj(get_tz()->get_history_item(
            vmg_ date->get_dayno(), date->get_daytime()));
    }
    else
    {
        /* no date argument - get the full history */
        retval->set_obj(get_tz()->get_history_list(vmg0_));
    }

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}